

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

uint64_t lzma_mt_block_size(lzma_filter *filters)

{
  lzma_filter_encoder *plVar1;
  uint64_t uVar2;
  uint64_t size;
  lzma_filter_encoder *fe;
  size_t i;
  uint64_t max;
  lzma_filter *filters_local;
  
  i = 0;
  fe = (lzma_filter_encoder *)0x0;
  do {
    if (filters[(long)fe].id == 0xffffffffffffffff) {
      return i;
    }
    plVar1 = encoder_find(filters[(long)fe].id);
    if (plVar1->block_size != (_func_uint64_t_void_ptr *)0x0) {
      uVar2 = (*plVar1->block_size)(filters[(long)fe].options);
      if (uVar2 == 0) {
        return 0;
      }
      if (i < uVar2) {
        i = uVar2;
      }
    }
    fe = (lzma_filter_encoder *)((long)&fe->id + 1);
  } while( true );
}

Assistant:

extern uint64_t
lzma_mt_block_size(const lzma_filter *filters)
{
	uint64_t max = 0;

	for (size_t i = 0; filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		const lzma_filter_encoder *const fe
				= encoder_find(filters[i].id);
		if (fe->block_size != NULL) {
			const uint64_t size
					= fe->block_size(filters[i].options);
			if (size == 0)
				return 0;

			if (size > max)
				max = size;
		}
	}

	return max;
}